

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::TracingServiceImpl::AttachConsumer
          (TracingServiceImpl *this,ConsumerEndpointImpl *consumer,string *key)

{
  char *pcVar1;
  TracingSession *pTVar2;
  bool bVar3;
  
  if (consumer->tracing_session_id_ == 0) {
    pTVar2 = GetDetachedSession(this,consumer->uid_,key);
    if (pTVar2 == (TracingSession *)0x0) {
      pcVar1 = base::Basename(
                             "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                             );
      bVar3 = false;
      base::LogMessage(kLogError,pcVar1,0xdd1a,
                       "Failed to attach consumer, session \'%s\' not found for uid %d",
                       (key->_M_dataplus)._M_p,(ulong)consumer->uid_);
    }
    else {
      consumer->tracing_session_id_ = pTVar2->id;
      pTVar2->consumer_maybe_null = consumer;
      (pTVar2->detach_key)._M_string_length = 0;
      *(pTVar2->detach_key)._M_dataplus._M_p = '\0';
      bVar3 = true;
    }
  }
  else {
    pcVar1 = base::Basename(
                           "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                           );
    bVar3 = false;
    base::LogMessage(kLogError,pcVar1,0xdd12,
                     "Cannot reattach consumer to session %s while it already attached tracing session ID %lu"
                     ,(key->_M_dataplus)._M_p,consumer->tracing_session_id_);
  }
  return bVar3;
}

Assistant:

bool TracingServiceImpl::AttachConsumer(ConsumerEndpointImpl* consumer,
                                        const std::string& key) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  PERFETTO_DLOG("Consumer %p attaching to session %s",
                reinterpret_cast<void*>(consumer), key.c_str());
  PERFETTO_DCHECK(consumers_.count(consumer));

  if (consumer->tracing_session_id_) {
    PERFETTO_ELOG(
        "Cannot reattach consumer to session %s"
        " while it already attached tracing session ID %" PRIu64,
        key.c_str(), consumer->tracing_session_id_);
    return false;
  }

  auto* tracing_session = GetDetachedSession(consumer->uid_, key);
  if (!tracing_session) {
    PERFETTO_ELOG(
        "Failed to attach consumer, session '%s' not found for uid %d",
        key.c_str(), static_cast<int>(consumer->uid_));
    return false;
  }

  consumer->tracing_session_id_ = tracing_session->id;
  tracing_session->consumer_maybe_null = consumer;
  tracing_session->detach_key.clear();
  return true;
}